

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O2

int ffgtknjj(fitsfile *fptr,int numkey,char *name,LONGLONG *value,int *status)

{
  int iVar1;
  int iVar2;
  char valuestring [71];
  char keyname [75];
  char comm [73];
  char message [81];
  
  if (0 < *status) {
    return *status;
  }
  keyname[0] = '\0';
  valuestring[0] = '\0';
  iVar1 = ffgkyn(fptr,numkey,keyname,valuestring,comm,status);
  if (iVar1 < 1) {
    iVar1 = strcmp(keyname,name);
    iVar2 = 0xd0;
    if (iVar1 == 0) {
      ffc2jj(valuestring,value,status);
      iVar2 = 0xd1;
      if ((*status < 1) && (-1 < *value)) goto LAB_0016dd23;
    }
    *status = iVar2;
    snprintf(message,0x51,"ffgtknjj found unexpected keyword or value for keyword no. %d.",numkey);
    ffpmsg(message);
    snprintf(message,0x51," Expected positive integer keyword %s, but instead",name);
    ffpmsg(message);
    snprintf(message,0x51," found keyword %s with value %s",keyname,valuestring);
    ffpmsg(message);
  }
LAB_0016dd23:
  return *status;
}

Assistant:

int ffgtknjj(fitsfile *fptr,  /* I - FITS file pointer              */
           int numkey,      /* I - number of the keyword to read  */
           char *name,      /* I - expected name of the keyword   */
           LONGLONG *value, /* O - integer value of the keyword   */
           int *status)     /* IO - error status                  */
{
/*
  test that keyword number NUMKEY has the expected name and get the
  integer value of the keyword.  Return an error if the keyword
  name does not match the input name, or if the value of the
  keyword is not a positive integer.
*/
    char keyname[FLEN_KEYWORD], valuestring[FLEN_VALUE];
    char comm[FLEN_COMMENT], message[FLEN_ERRMSG];
   
    if (*status > 0)
        return(*status);
    
    keyname[0] = '\0';
    valuestring[0] = '\0';

    if (ffgkyn(fptr, numkey, keyname, valuestring, comm, status) <= 0)
    {
        if (strcmp(keyname, name) )
            *status = BAD_ORDER;  /* incorrect keyword name */

        else
        {
            ffc2jj(valuestring, value, status);  /* convert to integer */

            if (*status > 0 || *value < 0 )
               *status = NOT_POS_INT;
        }

        if (*status > 0)
        {
            snprintf(message, FLEN_ERRMSG,
              "ffgtknjj found unexpected keyword or value for keyword no. %d.",
              numkey);
            ffpmsg(message);

            snprintf(message, FLEN_ERRMSG,
              " Expected positive integer keyword %s, but instead", name);
            ffpmsg(message);

            snprintf(message, FLEN_ERRMSG,
              " found keyword %s with value %s", keyname, valuestring);
            ffpmsg(message);
        }
    }

    return(*status);
}